

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O3

void leveldb::WriteBatchInternal::Append(WriteBatch *dst,WriteBatch *src)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = (int *)((dst->rep_)._M_dataplus._M_p + 8);
  *piVar1 = *piVar1 + *(int *)((src->rep_)._M_dataplus._M_p + 8);
  uVar3 = (src->rep_)._M_string_length;
  if (uVar3 < 0xc) {
    __assert_fail("src->rep_.size() >= kHeader",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/write_batch.cc"
                  ,0x92,
                  "static void leveldb::WriteBatchInternal::Append(WriteBatch *, const WriteBatch *)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&dst->rep_,(src->rep_)._M_dataplus._M_p + 0xc,uVar3 - 0xc);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteBatchInternal::Append(WriteBatch* dst, const WriteBatch* src) {
  SetCount(dst, Count(dst) + Count(src));
  assert(src->rep_.size() >= kHeader);
  dst->rep_.append(src->rep_.data() + kHeader, src->rep_.size() - kHeader);
}